

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

QList<QByteArray> * QTimeZone::availableTimeZoneIds(void)

{
  Type *pTVar1;
  QList<QByteArray> *in_RDI;
  QArrayDataPointer<QByteArray> *this;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> local_c0;
  QUtcTimeZonePrivate local_a8;
  QArrayDataPointer<QByteArray> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QUtcTimeZonePrivate::QUtcTimeZonePrivate(&local_a8);
  this = &local_30;
  QUtcTimeZonePrivate::availableTimeZoneIds((QList<QByteArray> *)this,&local_a8);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
           operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>
                       *)this);
  (*((pTVar1->backend).d.ptr)->_vptr_QTimeZonePrivate[0x15])(&local_c0);
  set_union(in_RDI,(QList<QByteArray> *)&local_30,(QList<QByteArray> *)&local_c0);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_c0);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_30);
  QUtcTimeZonePrivate::~QUtcTimeZonePrivate(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZone::availableTimeZoneIds()
{
    // Backends MUST implement availableTimeZoneIds().
    // The return from each backend MUST be sorted and unique.
    return set_union(QUtcTimeZonePrivate().availableTimeZoneIds(),
                     global_tz->backend->availableTimeZoneIds());
}